

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O1

bool __thiscall MeshLib::Solid::collapsable(Solid *this,HalfEdge *halfedge)

{
  HalfEdge *pHVar1;
  Face *pFVar2;
  Face *pFVar3;
  Vertex *pVVar4;
  Vertex *this_00;
  tVertex t;
  tVertex pVVar5;
  Solid *pSVar6;
  Face *pFVar7;
  bool bVar8;
  vector<MeshLib::HalfEdge_*,_std::allocator<MeshLib::HalfEdge_*>_> thlist;
  List<MeshLib::Vertex> verts;
  HalfEdge *he;
  HalfEdge **local_98;
  iterator iStack_90;
  HalfEdge **local_88;
  VertexInHalfedgeIterator local_80;
  VertexVertexIterator local_68;
  tVertex local_58;
  Vertex *local_50;
  Vertex *local_48;
  Edge *local_40;
  Vertex *local_38;
  
  local_40 = halfedge->m_edge;
  pHVar1 = local_40->m_halfedge[local_40->m_halfedge[0] == halfedge];
  if (pHVar1 == (HalfEdge *)0x0) {
    pFVar7 = (Face *)0x0;
  }
  else {
    pFVar7 = pHVar1->m_face;
  }
  local_80.m_vertex = halfedge->m_vertex;
  if (pHVar1 == (HalfEdge *)0x0) {
    local_58 = (tVertex)0x0;
  }
  else {
    local_58 = pHVar1->m_next->m_vertex;
  }
  pFVar2 = halfedge->m_face;
  local_50 = halfedge->m_prev->m_vertex;
  local_48 = halfedge->m_next->m_vertex;
  local_98 = (HalfEdge **)0x0;
  iStack_90._M_current = (HalfEdge **)0x0;
  local_88 = (HalfEdge **)0x0;
  local_80.m_solid = this;
  local_38 = local_80.m_vertex;
  local_80.m_halfedge = Vertex::most_clw_in_halfedge(local_80.m_vertex);
  while ((Vertex *)local_80.m_halfedge != (Vertex *)0x0) {
    local_68.m_vertex = (tVertex)local_80.m_halfedge;
    pFVar3 = (Face *)((Point *)&(local_80.m_halfedge)->m_face)->v[0];
    if ((pFVar3 != pFVar2) && (pFVar3 != pFVar7)) {
      if (iStack_90._M_current == local_88) {
        std::vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>>::
        _M_realloc_insert<MeshLib::HalfEdge*const&>
                  ((vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>> *)&local_98,
                   iStack_90,(HalfEdge **)&local_68);
      }
      else {
        *iStack_90._M_current = local_80.m_halfedge;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
    }
    VertexInHalfedgeIterator::operator++(&local_80);
  }
  local_80.m_vertex = local_50;
  local_80.m_solid = this;
  local_80.m_halfedge = Vertex::most_clw_in_halfedge(local_50);
  while ((Vertex *)local_80.m_halfedge != (Vertex *)0x0) {
    local_68.m_vertex = (tVertex)local_80.m_halfedge;
    pFVar3 = (Face *)((Point *)&(local_80.m_halfedge)->m_face)->v[0];
    if ((pFVar3 != pFVar2) && (pFVar3 != pFVar7)) {
      if (iStack_90._M_current == local_88) {
        std::vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>>::
        _M_realloc_insert<MeshLib::HalfEdge*const&>
                  ((vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>> *)&local_98,
                   iStack_90,(HalfEdge **)&local_68);
      }
      else {
        *iStack_90._M_current = local_80.m_halfedge;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
    }
    VertexInHalfedgeIterator::operator++(&local_80);
  }
  if (iStack_90._M_current != local_98) {
    iStack_90._M_current = local_98;
    local_80.m_vertex = local_48;
    local_80.m_solid = this;
    local_80.m_halfedge = Vertex::most_clw_in_halfedge(local_48);
    while (this_00 = local_38, (Vertex *)local_80.m_halfedge != (Vertex *)0x0) {
      local_68.m_vertex = (tVertex)local_80.m_halfedge;
      pFVar3 = (Face *)((Point *)&(local_80.m_halfedge)->m_face)->v[0];
      if ((pFVar3 != pFVar2) && (pFVar3 != pFVar7)) {
        if (iStack_90._M_current == local_88) {
          std::vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>>::
          _M_realloc_insert<MeshLib::HalfEdge*const&>
                    ((vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>> *)&local_98,
                     iStack_90,(HalfEdge **)&local_68);
        }
        else {
          *iStack_90._M_current = local_80.m_halfedge;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
      }
      VertexInHalfedgeIterator::operator++(&local_80);
    }
    if (iStack_90._M_current != local_98) {
      if (local_58 != (Vertex *)0x0) {
        if (iStack_90._M_current != local_98) {
          iStack_90._M_current = local_98;
        }
        local_80.m_vertex = local_58;
        local_80.m_solid = this;
        local_80.m_halfedge = Vertex::most_clw_in_halfedge(local_58);
        while ((Vertex *)local_80.m_halfedge != (Vertex *)0x0) {
          local_68.m_vertex = (tVertex)local_80.m_halfedge;
          pFVar3 = (Face *)((Point *)&(local_80.m_halfedge)->m_face)->v[0];
          if ((pFVar3 != pFVar2) && (pFVar3 != pFVar7)) {
            if (iStack_90._M_current == local_88) {
              std::vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>>::
              _M_realloc_insert<MeshLib::HalfEdge*const&>
                        ((vector<MeshLib::HalfEdge*,std::allocator<MeshLib::HalfEdge*>> *)&local_98,
                         iStack_90,(HalfEdge **)&local_68);
            }
            else {
              *iStack_90._M_current = local_80.m_halfedge;
              iStack_90._M_current = iStack_90._M_current + 1;
            }
          }
          VertexInHalfedgeIterator::operator++(&local_80);
        }
        if (iStack_90._M_current == local_98) goto LAB_0010eeb2;
      }
      if (((local_50->m_boundary != true) || (this_00->m_boundary != true)) ||
         ((local_40->m_halfedge[0] == (HalfEdge *)0x0) !=
          (local_40->m_halfedge[1] == (HalfEdge *)0x0))) {
        local_80.m_solid = (Solid *)0x0;
        local_80.m_vertex = (tVertex)((ulong)local_80.m_vertex & 0xffffffff00000000);
        local_68.m_vertex = local_50;
        local_68.m_halfedge = Vertex::most_clw_out_halfedge(local_50);
        pVVar4 = local_48;
        pVVar5 = local_58;
        while (local_68.m_halfedge != (HalfEdge *)0x0) {
          t = VertexVertexIterator::value(&local_68);
          if ((t != pVVar4) && (t != pVVar5)) {
            List<MeshLib::Vertex>::Append((List<MeshLib::Vertex> *)&local_80,t);
          }
          VertexVertexIterator::operator++(&local_68);
        }
        local_68.m_vertex = this_00;
        local_68.m_halfedge = Vertex::most_clw_out_halfedge(this_00);
        while (bVar8 = local_68.m_halfedge == (HalfEdge *)0x0, !bVar8) {
          pVVar5 = VertexVertexIterator::value(&local_68);
          for (pSVar6 = local_80.m_solid; pSVar6 != (Solid *)0x0;
              pSVar6 = (Solid *)(pSVar6->m_edges).root) {
            if ((tVertex)pSVar6->_vptr_Solid == pVVar5) goto LAB_0010eefe;
          }
          VertexVertexIterator::operator++(&local_68);
        }
LAB_0010eefe:
        List<MeshLib::Vertex>::~List((List<MeshLib::Vertex> *)&local_80);
        goto LAB_0010ef08;
      }
    }
  }
LAB_0010eeb2:
  bVar8 = false;
LAB_0010ef08:
  if (local_98 != (HalfEdge **)0x0) {
    operator_delete(local_98);
  }
  return bVar8;
}

Assistant:

bool Solid::collapsable (HalfEdge * halfedge) {
	Edge * edge = halfedge->edge ();
	Vertex * source = halfedge->source ();
	Vertex * target = halfedge->target ();
	Face * fL = halfedge->face ();
	Face * fR = halfedge->he_sym ()!= NULL?halfedge->he_sym()->face ():NULL;
	Vertex * vL = halfedge->he_next ()->target ();
	Vertex * vR = halfedge->he_sym ()!= NULL? halfedge->he_sym ()->he_next ()->target ():NULL;
	std::vector <HalfEdge *> thlist;
	for( VertexInHalfedgeIterator vhiter( this, target );!vhiter.end(); ++ vhiter ) {
		HalfEdge * he = *vhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}

	for( VertexInHalfedgeIterator svhiter( this, source );!svhiter.end(); ++ svhiter ) {
		HalfEdge * he = *svhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}
	if(thlist.size () == 0) return false;

	thlist.clear ();
	for( VertexInHalfedgeIterator lvhiter( this, vL );!lvhiter.end(); ++ lvhiter )
	{
		HalfEdge * he = *lvhiter;

		if( he->face() == fL ) continue;
		if( he->face() == fR ) continue;

		thlist.push_back ( he );
	}
	if(thlist.size () == 0) return false;
	if( vR != NULL ) {
		thlist.clear ();
		for( VertexInHalfedgeIterator rvhiter( this, vR );!rvhiter.end(); ++ rvhiter ) {
			HalfEdge * he = *rvhiter;

			if( he->face() == fL ) continue;
			if( he->face() == fR ) continue;

			thlist.push_back ( he );
		}
		if(thlist.size () == 0) return false;
	}

	if( source->boundary() && target->boundary() && !edge->boundary() )
		return false;

	List<Vertex> verts;

	for( VertexVertexIterator vviter( source ); !vviter.end(); ++ vviter ) {
		Vertex * v = *vviter;
		if( v == vL ) continue;
		if( v == vR ) continue;
		verts.Append( v );
	}

	for( VertexVertexIterator viter(  target ); !viter.end(); ++ viter ) {
		Vertex * v = *viter;
		if( verts.contains( v ) ) return false;
	}

	return true;
}